

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O3

void __thiscall
OpenMD::ZConstraintForceModifier::calcTotalMassMovingZMols(ZConstraintForceModifier *this)

{
  _List_node_base *p_Var1;
  RealType RVar2;
  
  this->totMassMovingZMols_ = 0.0;
  for (p_Var1 = (this->movingZMols_).
                super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)&this->movingZMols_; p_Var1 = p_Var1->_M_next) {
    RVar2 = Molecule::getMass((Molecule *)p_Var1[1]._M_next);
    this->totMassMovingZMols_ = RVar2 + this->totMassMovingZMols_;
  }
  return;
}

Assistant:

void ZConstraintForceModifier::calcTotalMassMovingZMols() {
    totMassMovingZMols_ = 0.0;
    std::list<ZconstraintMol>::iterator i;
    for (i = movingZMols_.begin(); i != movingZMols_.end(); ++i) {
      totMassMovingZMols_ += i->mol->getMass();
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &totMassMovingZMols_, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif
  }